

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glx_context.c
# Opt level: O2

int getFBConfigAttrib(GLXFBConfig fbconfig,int attrib)

{
  undefined8 in_RAX;
  int value;
  int local_4;
  
  local_4 = (int)((ulong)in_RAX >> 0x20);
  if (_glfw.glx.SGIX_fbconfig == '\0') {
    glXGetFBConfigAttrib(_glfw.x11.display,fbconfig,attrib,&local_4);
  }
  else {
    (*_glfw.glx.GetFBConfigAttribSGIX)(_glfw.x11.display,fbconfig,attrib,&local_4);
  }
  return local_4;
}

Assistant:

static int getFBConfigAttrib(GLXFBConfig fbconfig, int attrib)
{
    int value;

    if (_glfw.glx.SGIX_fbconfig)
    {
        _glfw.glx.GetFBConfigAttribSGIX(_glfw.x11.display,
                                        fbconfig, attrib, &value);
    }
    else
        glXGetFBConfigAttrib(_glfw.x11.display, fbconfig, attrib, &value);

    return value;
}